

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::SetArgs(cmake *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  pointer pbVar1;
  size_type sVar2;
  size_type sVar3;
  bool bVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  LogLevel LVar9;
  long lVar10;
  ulong uVar11;
  ostream *poVar12;
  cmGlobalGenerator *gg;
  string *psVar13;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar14;
  undefined1 extraout_DL_01;
  string *psVar15;
  uint uVar16;
  ulong uVar17;
  string kdevError;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90 = &this->TraceOnlyThisSources;
  local_88 = (string *)&this->GraphVizFile;
  local_80 = (string *)&this->CheckStampList;
  local_78 = (string *)&this->CheckStampFile;
  local_70 = (string *)&this->CheckBuildSystemArgument;
  local_58 = &this->GeneratorInstance;
  local_60 = &this->GeneratorPlatform;
  local_68 = &this->GeneratorToolset;
  uVar17 = 1;
  bVar6 = false;
  bVar7 = false;
LAB_0022b942:
  uVar16 = (uint)uVar17;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar17)
  goto LAB_0022c3ae;
  psVar13 = pbVar1 + uVar17;
  lVar10 = std::__cxx11::string::find((char *)psVar13,0x4afe6c);
  if ((lVar10 == 0) || (lVar10 = std::__cxx11::string::find((char *)psVar13,0x4afe91), lVar10 == 0))
  {
    std::__cxx11::string::substr((ulong)&value,(ulong)psVar13);
    uVar5 = uVar16;
    if (value._M_string_length == 0) {
      if ((ulong)(uVar16 + 1) <
          (ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5)) {
        std::__cxx11::string::_M_assign((string *)&value);
        uVar5 = uVar16 + 1;
        if (*value._M_dataplus._M_p != '-') goto LAB_0022bc8a;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&kdevError,"No source directory specified for -S",
                   (allocator<char> *)&local_b0);
        cmSystemTools::Error(&kdevError);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&kdevError,"No source directory specified for -S",
                   (allocator<char> *)&local_b0);
        cmSystemTools::Error(&kdevError);
      }
LAB_0022bd32:
      uVar16 = uVar16 + 1;
      goto LAB_0022bd35;
    }
LAB_0022bc8a:
    uVar16 = uVar5;
    cmsys::SystemTools::CollapseFullPath(&kdevError,&value);
    std::__cxx11::string::operator=((string *)&value,(string *)&kdevError);
    std::__cxx11::string::~string((string *)&kdevError);
    cmsys::SystemTools::ConvertToUnixSlashes(&value);
    bVar4 = true;
    SetHomeDirectory(this,&value);
LAB_0022bd92:
    std::__cxx11::string::~string((string *)&value);
    if (!bVar4) {
      return;
    }
  }
  else {
    lVar10 = std::__cxx11::string::find((char *)psVar13,0x4953b2);
    if (lVar10 == 0) goto LAB_0022bda3;
    lVar10 = std::__cxx11::string::find((char *)psVar13,0x4afeb5);
    if (lVar10 == 0) {
      std::__cxx11::string::substr((ulong)&value,(ulong)psVar13);
      uVar5 = uVar16;
      if (value._M_string_length == 0) {
        if ((ulong)(uVar16 + 1) <
            (ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5)) {
          std::__cxx11::string::_M_assign((string *)&value);
          uVar5 = uVar16 + 1;
          if (*value._M_dataplus._M_p != '-') goto LAB_0022bd5e;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&kdevError,"No build directory specified for -B",
                     (allocator<char> *)&local_b0);
          cmSystemTools::Error(&kdevError);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&kdevError,"No build directory specified for -B",
                     (allocator<char> *)&local_b0);
          cmSystemTools::Error(&kdevError);
        }
        goto LAB_0022bd32;
      }
LAB_0022bd5e:
      uVar16 = uVar5;
      cmsys::SystemTools::CollapseFullPath(&kdevError,&value);
      std::__cxx11::string::operator=((string *)&value,(string *)&kdevError);
      std::__cxx11::string::~string((string *)&kdevError);
      cmsys::SystemTools::ConvertToUnixSlashes(&value);
      bVar4 = true;
      SetHomeOutputDirectory(this,&value);
      goto LAB_0022bd92;
    }
    lVar10 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar17 < lVar10 - 2U) {
      lVar10 = std::__cxx11::string::find((char *)psVar13,0x4afeb8);
      if (lVar10 == 0) {
        std::__cxx11::string::_M_assign(local_70);
        uVar16 = uVar16 + 2;
        iVar8 = atoi((args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p);
        this->ClearBuildSystem = 0 < iVar8;
        goto LAB_0022bda3;
      }
      lVar10 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5;
    }
    uVar11 = lVar10 - 1;
    if (uVar17 < uVar11) {
      lVar10 = std::__cxx11::string::find((char *)psVar13,0x4afecd);
      psVar15 = local_78;
      if (lVar10 != 0) {
        uVar11 = ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
        goto LAB_0022ba37;
      }
    }
    else {
LAB_0022ba37:
      if ((uVar11 <= uVar17) ||
         (lVar10 = std::__cxx11::string::find((char *)psVar13,0x4afee0), psVar15 = local_80,
         lVar10 != 0)) {
        lVar10 = std::__cxx11::string::find((char *)psVar13,0x4bfece);
        if ((lVar10 == 0) ||
           ((lVar10 = std::__cxx11::string::find((char *)psVar13,0x49540f), lVar10 == 0 ||
            (lVar10 = std::__cxx11::string::find((char *)psVar13,0x495297), lVar10 == 0)))) {
          uVar16 = uVar16 + (psVar13->_M_string_length == 2);
        }
        else {
          lVar10 = std::__cxx11::string::find((char *)psVar13,0x4a290b);
          if ((lVar10 == 0) ||
             (lVar10 = std::__cxx11::string::find((char *)psVar13,0x4afda3), lVar10 == 0)) {
            uVar16 = uVar16 + 1;
          }
          else {
            lVar10 = std::__cxx11::string::find((char *)psVar13,0x4953c2);
            if (lVar10 == 0) goto LAB_0022bda3;
            lVar10 = std::__cxx11::string::find((char *)psVar13,0x4afef3);
            if (lVar10 == 0) {
              std::__cxx11::string::substr((ulong)&value,(ulong)psVar13);
              cmsys::SystemTools::CollapseFullPath(&kdevError,&value);
              std::__cxx11::string::operator=((string *)&value,(string *)&kdevError);
              std::__cxx11::string::~string((string *)&kdevError);
              cmsys::SystemTools::ConvertToUnixSlashes(&value);
              std::__cxx11::string::_M_assign(local_88);
              if ((this->GraphVizFile)._M_string_length == 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&kdevError,"No file specified for --graphviz",
                           (allocator<char> *)&local_b0);
                cmSystemTools::Error(&kdevError);
                std::__cxx11::string::~string((string *)&kdevError);
                goto LAB_0022c46c;
              }
LAB_0022bf62:
              std::__cxx11::string::~string((string *)&value);
            }
            else {
              lVar10 = std::__cxx11::string::find((char *)psVar13,0x4aff20);
              if (lVar10 == 0) {
                std::operator<<((ostream *)&std::cout,"debug trycompile on\n");
                this->DebugTryCompile = true;
              }
              else {
                lVar10 = std::__cxx11::string::find((char *)psVar13,0x4aff48);
                if (lVar10 == 0) {
                  std::operator<<((ostream *)&std::cout,"Running with debug output on.\n");
                  this->DebugOutput = true;
                }
                else {
                  lVar10 = std::__cxx11::string::find((char *)psVar13,0x4aff76);
                  if (lVar10 == 0) {
                    std::__cxx11::string::substr((ulong)&value,(ulong)psVar13);
                    LVar9 = StringToLogLevel(&value);
                    std::__cxx11::string::~string((string *)&value);
                    if (LVar9 == LOG_UNDEFINED) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&value,"Invalid level specified for --loglevel",
                                 (allocator<char> *)&kdevError);
                      cmSystemTools::Error(&value);
                      goto LAB_0022c46c;
                    }
                    this->MessageLogLevel = LVar9;
                  }
                  else {
                    lVar10 = std::__cxx11::string::find((char *)psVar13,0x4affa9);
                    if (lVar10 == 0) {
                      std::operator<<((ostream *)&std::cout,
                                      "Running with expanded trace output on.\n");
                      this->Trace = true;
                      this->TraceExpand = true;
                    }
                    else {
                      lVar10 = std::__cxx11::string::find((char *)psVar13,0x4affe0);
                      if (lVar10 == 0) {
                        std::__cxx11::string::substr((ulong)&value,(ulong)psVar13);
                        cmsys::SystemTools::ConvertToUnixSlashes(&value);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back(local_90,&value);
                        this->Trace = true;
                        goto LAB_0022bf62;
                      }
                      lVar10 = std::__cxx11::string::find((char *)psVar13,0x4afff0);
                      if (lVar10 == 0) {
                        std::operator<<((ostream *)&std::cout,"Running with trace output on.\n");
                        this->Trace = true;
                        this->TraceExpand = false;
                      }
                      else {
                        lVar10 = std::__cxx11::string::find((char *)psVar13,0x4b0017);
                        if (lVar10 == 0) {
                          std::operator<<((ostream *)&std::cout,"Warn about uninitialized values.\n"
                                         );
                          this->WarnUninitialized = true;
                        }
                        else {
                          lVar10 = std::__cxx11::string::find((char *)psVar13,0x4b004e);
                          if (lVar10 == 0) {
                            std::operator<<((ostream *)&std::cout,"Finding unused variables.\n");
                            this->WarnUnused = true;
                          }
                          else {
                            lVar10 = std::__cxx11::string::find((char *)psVar13,0x4b007c);
                            if (lVar10 == 0) {
                              poVar12 = std::operator<<((ostream *)&std::cout,
                                                                                                                
                                                  "Not searching for unused variables given on the "
                                                  );
                              std::operator<<(poVar12,"command line.\n");
                              this->WarnUnusedCli = false;
                            }
                            else {
                              lVar10 = std::__cxx11::string::find((char *)psVar13,0x4b00d1);
                              if (lVar10 != 0) {
                                lVar10 = std::__cxx11::string::find((char *)psVar13,0x4b0150);
                                if (lVar10 == 0) {
                                  std::__cxx11::string::substr((ulong)&value,(ulong)psVar13);
                                  if (value._M_string_length == 0) {
                                    uVar16 = uVar16 + 1;
                                    if ((ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5)
                                        <= (ulong)uVar16) {
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&kdevError,"No platform specified for -A"
                                                 ,(allocator<char> *)&local_b0);
                                      cmSystemTools::Error(&kdevError);
LAB_0022bd35:
                                      std::__cxx11::string::~string((string *)&kdevError);
                                      goto LAB_0022bd3a;
                                    }
                                    std::__cxx11::string::_M_assign((string *)&value);
                                  }
                                  if (!bVar6) {
                                    bVar4 = true;
                                    SetGeneratorPlatform(this,&value);
                                    bVar6 = true;
                                    goto LAB_0022bd92;
                                  }
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&kdevError,"Multiple -A options not allowed",
                                             (allocator<char> *)&local_b0);
                                  cmSystemTools::Error(&kdevError);
                                  std::__cxx11::string::~string((string *)&kdevError);
                                  bVar6 = true;
                                }
                                else {
                                  lVar10 = std::__cxx11::string::find((char *)psVar13,0x4b018c);
                                  if (lVar10 != 0) {
                                    lVar10 = std::__cxx11::string::find((char *)psVar13,0x4b01ca);
                                    if (lVar10 == 0) {
                                      std::__cxx11::string::substr((ulong)&value,(ulong)psVar13);
                                      if (value._M_string_length == 0) {
                                        uVar16 = uVar16 + 1;
                                        if ((ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5)
                                            <= (ulong)uVar16) {
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&kdevError,
                                                     "No generator specified for -G",
                                                     (allocator<char> *)&local_b0);
                                          cmSystemTools::Error(&kdevError);
                                          std::__cxx11::string::~string((string *)&kdevError);
                                          PrintGeneratorList(this);
                                          goto LAB_0022bd3a;
                                        }
                                        std::__cxx11::string::_M_assign((string *)&value);
                                      }
                                      gg = CreateGlobalGenerator(this,&value);
                                      if (gg != (cmGlobalGenerator *)0x0) {
                                        bVar4 = true;
                                        SetGlobalGenerator(this,gg);
                                        goto LAB_0022bd92;
                                      }
                                      kdevError._M_dataplus._M_p = (pointer)&kdevError.field_2;
                                      kdevError._M_string_length = 0;
                                      kdevError.field_2._M_local_buf[0] = '\0';
                                      lVar10 = std::__cxx11::string::find((char *)&value,0x4b01cd);
                                      if (lVar10 != -1) {
                                        std::__cxx11::string::assign((char *)&kdevError);
                                      }
                                      std::operator+(&local_50,"Could not create named generator ",
                                                     &value);
                                      std::operator+(&local_b0,&local_50,&kdevError);
                                      cmSystemTools::Error(&local_b0);
                                      std::__cxx11::string::~string((string *)&local_b0);
                                      std::__cxx11::string::~string((string *)&local_50);
                                      PrintGeneratorList(this);
                                      goto LAB_0022bd35;
                                    }
                                    SetDirectoriesFromFile(this,psVar13);
                                    goto LAB_0022bda3;
                                  }
                                  std::__cxx11::string::substr((ulong)&value,(ulong)psVar13);
                                  if (value._M_string_length == 0) {
                                    uVar16 = uVar16 + 1;
                                    if ((ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5)
                                        <= (ulong)uVar16) {
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&kdevError,"No toolset specified for -T",
                                                 (allocator<char> *)&local_b0);
                                      cmSystemTools::Error(&kdevError);
                                      goto LAB_0022bd35;
                                    }
                                    std::__cxx11::string::_M_assign((string *)&value);
                                  }
                                  if (!bVar7) {
                                    bVar4 = true;
                                    SetGeneratorToolset(this,&value);
                                    bVar7 = true;
                                    goto LAB_0022bd92;
                                  }
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&kdevError,"Multiple -T options not allowed",
                                             (allocator<char> *)&local_b0);
                                  cmSystemTools::Error(&kdevError);
                                  std::__cxx11::string::~string((string *)&kdevError);
                                  bVar7 = true;
                                }
LAB_0022bd3a:
                                bVar4 = false;
                                goto LAB_0022bd92;
                              }
                              poVar12 = std::operator<<((ostream *)&std::cout,
                                                                                                                
                                                  "Also check system files when warning about unused and "
                                                  );
                              std::operator<<(poVar12,"uninitialized variables.\n");
                              this->CheckSystemVars = true;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_0022bda3;
      }
    }
    uVar16 = uVar16 + 1;
    std::__cxx11::string::_M_assign(psVar15);
  }
LAB_0022bda3:
  if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
    std::__cxx11::string::assign((char *)local_58);
    if (this->GeneratorPlatformSet == false) {
      std::__cxx11::string::assign((char *)local_60);
    }
    if (this->GeneratorToolsetSet == false) {
      std::__cxx11::string::assign((char *)local_68);
    }
  }
  uVar17 = (ulong)(uVar16 + 1);
  goto LAB_0022b942;
LAB_0022c3ae:
  psVar13 = GetHomeDirectory_abi_cxx11_(this);
  sVar2 = psVar13->_M_string_length;
  psVar13 = GetHomeOutputDirectory_abi_cxx11_(this);
  sVar3 = psVar13->_M_string_length;
  if ((sVar3 == 0 && sVar2 == 0) && this->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,
               "No source or binary directory provided. Both will be assumed to be the same as the current working directory, but note that this warning will become a fatal error in future CMake releases."
               ,(allocator<char> *)&local_b0);
    kdevError._M_dataplus._M_p = (pointer)0x0;
    kdevError._M_string_length = 0;
    IssueMessage(this,WARNING,&value,(cmListFileBacktrace *)&kdevError);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&kdevError._M_string_length);
    std::__cxx11::string::~string((string *)&value);
    uVar14 = extraout_DL_00;
  }
  else {
    uVar14 = extraout_DL;
    if (sVar2 != 0) goto LAB_0022c44c;
  }
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&value,(SystemTools *)0x1,(bool)uVar14);
  SetHomeDirectory(this,&value);
  std::__cxx11::string::~string((string *)&value);
  uVar14 = extraout_DL_01;
LAB_0022c44c:
  if (sVar3 == 0) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&value,(SystemTools *)0x1,(bool)uVar14);
    SetHomeOutputDirectory(this,&value);
LAB_0022c46c:
    std::__cxx11::string::~string((string *)&value);
  }
  return;
}

Assistant:

void cmake::SetArgs(const std::vector<std::string>& args)
{
  bool haveToolset = false;
  bool havePlatform = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-H", 0) == 0 || arg.find("-S", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeDirectory(path);
    } else if (arg.find("-O", 0) == 0) {
      // There is no local generate anymore.  Ignore -O option.
    } else if (arg.find("-B", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeOutputDirectory(path);
    } else if ((i < args.size() - 2) &&
               (arg.find("--check-build-system", 0) == 0)) {
      this->CheckBuildSystemArgument = args[++i];
      this->ClearBuildSystem = (atoi(args[++i].c_str()) > 0);
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-file", 0) == 0)) {
      this->CheckStampFile = args[++i];
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-list", 0) == 0)) {
      this->CheckStampList = args[++i];
    }
#if defined(CMAKE_HAVE_VS_GENERATORS)
    else if ((i < args.size() - 1) &&
             (arg.find("--vs-solution-file", 0) == 0)) {
      this->VSSolutionFile = args[++i];
    }
#endif
    else if (arg.find("-D", 0) == 0) {
      // skip for now
      // in case '-D var=val' is given, also skip the next
      // in case '-Dvar=val' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-U", 0) == 0) {
      // skip for now
      // in case '-U var' is given, also skip the next
      // in case '-Uvar' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-C", 0) == 0) {
      // skip for now
      // in case '-C path' is given, also skip the next
      // in case '-Cpath' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-P", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("--find-package", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("-W", 0) == 0) {
      // skip for now
    } else if (arg.find("--graphviz=", 0) == 0) {
      std::string path = arg.substr(strlen("--graphviz="));
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->GraphVizFile = path;
      if (this->GraphVizFile.empty()) {
        cmSystemTools::Error("No file specified for --graphviz");
        return;
      }
    } else if (arg.find("--debug-trycompile", 0) == 0) {
      std::cout << "debug trycompile on\n";
      this->DebugTryCompileOn();
    } else if (arg.find("--debug-output", 0) == 0) {
      std::cout << "Running with debug output on.\n";
      this->SetDebugOutputOn(true);
    } else if (arg.find("--loglevel=", 0) == 0) {
      const auto logLevel =
        StringToLogLevel(arg.substr(sizeof("--loglevel=") - 1));
      if (logLevel == LogLevel::LOG_UNDEFINED) {
        cmSystemTools::Error("Invalid level specified for --loglevel");
        return;
      }
      this->SetLogLevel(logLevel);
    } else if (arg.find("--trace-expand", 0) == 0) {
      std::cout << "Running with expanded trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(true);
    } else if (arg.find("--trace-source=", 0) == 0) {
      std::string file = arg.substr(strlen("--trace-source="));
      cmSystemTools::ConvertToUnixSlashes(file);
      this->AddTraceSource(file);
      this->SetTrace(true);
    } else if (arg.find("--trace", 0) == 0) {
      std::cout << "Running with trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(false);
    } else if (arg.find("--warn-uninitialized", 0) == 0) {
      std::cout << "Warn about uninitialized values.\n";
      this->SetWarnUninitialized(true);
    } else if (arg.find("--warn-unused-vars", 0) == 0) {
      std::cout << "Finding unused variables.\n";
      this->SetWarnUnused(true);
    } else if (arg.find("--no-warn-unused-cli", 0) == 0) {
      std::cout << "Not searching for unused variables given on the "
                << "command line.\n";
      this->SetWarnUnusedCli(false);
    } else if (arg.find("--check-system-vars", 0) == 0) {
      std::cout << "Also check system files when warning about unused and "
                << "uninitialized variables.\n";
      this->SetCheckSystemVars(true);
    } else if (arg.find("-A", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No platform specified for -A");
          return;
        }
        value = args[i];
      }
      if (havePlatform) {
        cmSystemTools::Error("Multiple -A options not allowed");
        return;
      }
      this->SetGeneratorPlatform(value);
      havePlatform = true;
    } else if (arg.find("-T", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No toolset specified for -T");
          return;
        }
        value = args[i];
      }
      if (haveToolset) {
        cmSystemTools::Error("Multiple -T options not allowed");
        return;
      }
      this->SetGeneratorToolset(value);
      haveToolset = true;
    } else if (arg.find("-G", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return;
        }
        value = args[i];
      }
      cmGlobalGenerator* gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        std::string kdevError;
        if (value.find("KDevelop3", 0) != std::string::npos) {
          kdevError = "\nThe KDevelop3 generator is not supported anymore.";
        }

        cmSystemTools::Error("Could not create named generator " + value +
                             kdevError);
        this->PrintGeneratorList();
        return;
      }
      this->SetGlobalGenerator(gen);
    }
    // no option assume it is the path to the source or an existing build
    else {
      this->SetDirectoriesFromFile(arg);
    }
    // Empty instance, platform and toolset if only a generator is specified
    if (this->GlobalGenerator) {
      this->GeneratorInstance = "";
      if (!this->GeneratorPlatformSet) {
        this->GeneratorPlatform = "";
      }
      if (!this->GeneratorToolsetSet) {
        this->GeneratorToolset = "";
      }
    }
  }